

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void adjust_grid(void)

{
  int local_14;
  int local_10;
  int y;
  int x;
  int pos;
  
  for (local_14 = 0; local_14 < 0x32; local_14 = local_14 + 1) {
    for (local_10 = 0; local_10 < 0x32; local_10 = local_10 + 1) {
      vertex[local_14 * 0x32 + local_10].z = (float)(p[local_10][local_14] * 0.02);
    }
  }
  return;
}

Assistant:

void adjust_grid(void)
{
    int pos;
    int x, y;

    for (y = 0; y < GRIDH;  y++)
    {
        for (x = 0;  x < GRIDW;  x++)
        {
            pos = y * GRIDW + x;
            vertex[pos].z = (float) (p[x][y] * (1.0 / 50.0));
        }
    }
}